

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

int nni_ctx_find(nni_ctx **cp,uint32_t id)

{
  nni_ctx *pnVar1;
  int iVar2;
  
  nni_mtx_lock(&sock_lk);
  pnVar1 = (nni_ctx *)nni_id_get(&ctx_ids,(ulong)id);
  iVar2 = 7;
  if (((pnVar1 != (nni_ctx *)0x0) && (pnVar1->c_closed == false)) &&
     (pnVar1->c_sock->s_closed == false)) {
    pnVar1->c_ref = pnVar1->c_ref + 1;
    *cp = pnVar1;
    iVar2 = 0;
  }
  nni_mtx_unlock(&sock_lk);
  return iVar2;
}

Assistant:

int
nni_ctx_find(nni_ctx **cp, uint32_t id)
{
	int      rv = 0;
	nni_ctx *ctx;

	nni_mtx_lock(&sock_lk);
	if ((ctx = nni_id_get(&ctx_ids, id)) != NULL) {
		// We refuse a reference if either the socket is
		// closed, or the context is closed.  (If the socket
		// is closed, and we are only getting the reference so
		// we can close it, then we still allow.  In the case
		// the only valid operation will be to close the
		// socket.)
		if (ctx->c_closed || ctx->c_sock->s_closed) {
			rv = NNG_ECLOSED;
		} else {
			ctx->c_ref++;
			*cp = ctx;
		}
	} else {
		rv = NNG_ECLOSED;
	}
	nni_mtx_unlock(&sock_lk);

	return (rv);
}